

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlNodePtr xmlAddChildList(xmlNodePtr parent,xmlNodePtr cur)

{
  _xmlNode **pp_Var1;
  xmlNodePtr text;
  _xmlNode *p_Var2;
  int iVar3;
  _xmlNode *p_Var4;
  undefined1 *puVar5;
  
  if (parent != (xmlNodePtr)0x0) {
    if (cur == (xmlNodePtr)0x0) {
      return (xmlNodePtr)0x0;
    }
    if (parent->type == XML_NAMESPACE_DECL) {
      return (xmlNodePtr)0x0;
    }
    puVar5 = (undefined1 *)0x0;
    p_Var4 = cur;
    if (cur->type == XML_NAMESPACE_DECL) {
      return (xmlNodePtr)0x0;
    }
    do {
      if ((p_Var4->doc != parent->doc) && (iVar3 = xmlSetTreeDoc(p_Var4,parent->doc), iVar3 < 0)) {
        puVar5 = &DAT_00000001;
      }
      pp_Var1 = &p_Var4->next;
      p_Var4 = *pp_Var1;
    } while (*pp_Var1 != (_xmlNode *)0x0);
    if ((int)puVar5 == 0) {
      if (parent->children == (_xmlNode *)0x0) {
        parent->children = cur;
      }
      else {
        text = parent->last;
        p_Var4 = cur;
        if (((cur->type == XML_TEXT_NODE) && (text->type == XML_TEXT_NODE)) &&
           (cur->name == text->name)) {
          iVar3 = xmlTextAddContent(text,cur->content,-1);
          if (iVar3 < 0) {
            return (xmlNodePtr)0x0;
          }
          p_Var4 = cur->next;
          xmlFreeNode(cur);
          if (p_Var4 == (_xmlNode *)0x0) {
            return text;
          }
        }
        text->next = p_Var4;
        p_Var4->prev = text;
        cur = p_Var4;
      }
      p_Var4 = cur->next;
      while (p_Var2 = p_Var4, p_Var2 != (_xmlNode *)0x0) {
        cur->parent = parent;
        cur = p_Var2;
        p_Var4 = p_Var2->next;
      }
      cur->parent = parent;
      parent->last = cur;
      return cur;
    }
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlAddChildList(xmlNodePtr parent, xmlNodePtr cur) {
    xmlNodePtr iter;
    xmlNodePtr prev;
    int oom;

    if ((parent == NULL) || (parent->type == XML_NAMESPACE_DECL)) {
	return(NULL);
    }

    if ((cur == NULL) || (cur->type == XML_NAMESPACE_DECL)) {
	return(NULL);
    }

    oom = 0;
    for (iter = cur; iter != NULL; iter = iter->next) {
	if (iter->doc != parent->doc) {
	    if (xmlSetTreeDoc(iter, parent->doc) < 0)
                oom = 1;
	}
    }
    if (oom)
        return(NULL);

    /*
     * add the first element at the end of the children list.
     */

    if (parent->children == NULL) {
        parent->children = cur;
    } else {
        prev = parent->last;

	/*
	 * If cur and parent->last both are TEXT nodes, then merge them.
	 */
	if ((cur->type == XML_TEXT_NODE) &&
	    (prev->type == XML_TEXT_NODE) &&
	    (cur->name == prev->name)) {
            xmlNodePtr next;

            if (xmlTextAddContent(prev, cur->content, -1) < 0)
                return(NULL);
            next = cur->next;
	    xmlFreeNode(cur);
	    /*
	     * if it's the only child, nothing more to be done.
	     */
	    if (next == NULL)
		return(prev);
	    cur = next;
	}

	prev->next = cur;
	cur->prev = prev;
    }
    while (cur->next != NULL) {
	cur->parent = parent;
        cur = cur->next;
    }
    cur->parent = parent;
    parent->last = cur;

    return(cur);
}